

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O2

vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> * __thiscall
chrono::ChArchiveExplorer::FetchValues<std::vector<myEmployee,std::allocator<myEmployee>>>
          (ChArchiveExplorer *this,vector<myEmployee,_std::allocator<myEmployee>_> *root,
          string *value_name)

{
  ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_> local_28;
  
  PrepareSearch(this,value_name);
  this->find_all = true;
  local_28._name = "";
  local_28._flags = '\0';
  local_28._value = root;
  ChArchiveOut::operator<<(&this->super_ChArchiveOut,&local_28);
  return &this->results;
}

Assistant:

std::vector<ChValue*>& FetchValues( T& root, const std::string& value_name) {
          this->PrepareSearch(value_name);
          this->find_all = true;
          this->operator<<( CHNVP(root,"") ); // SCAN! 
          return this->results;
      }